

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

string * minja::error_location_suffix(string *__return_storage_ptr__,string *source,size_t pos)

{
  pointer pcVar1;
  long lVar2;
  ostream *poVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  string *psVar5;
  size_t sVar6;
  size_type sVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  char *pcVar11;
  long lVar12;
  ostringstream out;
  undefined1 local_1e1;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  size_t local_1c0;
  ulong local_1b8;
  string *local_1b0;
  long *local_1a8 [2];
  long local_198 [12];
  ios_base local_138 [264];
  
  pcVar1 = (source->_M_dataplus)._M_p;
  if (pos == 0) {
    uVar10 = 0;
  }
  else {
    sVar6 = 0;
    uVar10 = 0;
    do {
      uVar10 = uVar10 + (pcVar1[sVar6] == '\n');
      sVar6 = sVar6 + 1;
    } while (pos != sVar6);
  }
  if (source->_M_string_length == 0) {
    lVar12 = 0;
  }
  else {
    sVar7 = 0;
    lVar12 = 0;
    do {
      lVar12 = lVar12 + (ulong)(pcVar1[sVar7] == '\n');
      sVar7 = sVar7 + 1;
    } while (source->_M_string_length != sVar7);
  }
  local_1c0 = pos;
  local_1b0 = __return_storage_ptr__;
  local_1a8[0] = local_198;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)local_1a8,pcVar1,pcVar1 + pos);
  lVar2 = std::__cxx11::string::rfind((char)(string *)local_1a8,10);
  if (local_1a8[0] != local_198) {
    operator_delete(local_1a8[0],local_198[0] + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," at row ",8);
  sVar6 = local_1c0;
  local_1b8 = uVar10 + 1;
  poVar3 = std::ostream::_M_insert<long>((long)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", column ",9);
  sVar6 = sVar6 - lVar2;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":\n",2);
  if (0 < (long)uVar10) {
    pcVar9 = (source->_M_dataplus)._M_p;
    pcVar11 = pcVar9;
    if (uVar10 != 1) {
      lVar2 = uVar10 - 1;
      do {
        local_1e1 = 10;
        _Var4 = std::
                __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          (pcVar11,(source->_M_dataplus)._M_p + source->_M_string_length,&local_1e1)
        ;
        pcVar11 = _Var4._M_current + 1;
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
      pcVar9 = (source->_M_dataplus)._M_p;
    }
    local_1e1 = 10;
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (pcVar11,pcVar9 + source->_M_string_length);
    local_1e0 = local_1d0;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_1e0,pcVar11,_Var4._M_current);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_1e0,local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0,local_1d0[0] + 1);
    }
  }
  pcVar9 = (source->_M_dataplus)._M_p;
  pcVar11 = pcVar9;
  if (1 < local_1b8) {
    uVar8 = uVar10;
    local_1c0 = sVar6;
    do {
      local_1e1 = 10;
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        (pcVar11,(source->_M_dataplus)._M_p + source->_M_string_length,&local_1e1);
      pcVar11 = _Var4._M_current + 1;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
    pcVar9 = (source->_M_dataplus)._M_p;
    sVar6 = local_1c0;
  }
  local_1e1 = 10;
  _Var4 = std::
          __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (pcVar11,pcVar9 + source->_M_string_length);
  local_1e0 = local_1d0;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_1e0,pcVar11,_Var4._M_current);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_1e0,local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0,local_1d0[0] + 1);
  }
  local_1e0 = local_1d0;
  std::__cxx11::string::_M_construct((ulong)&local_1e0,(char)sVar6 + -1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_1e0,local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"^\n",2);
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0,local_1d0[0] + 1);
  }
  if ((long)uVar10 < lVar12) {
    pcVar9 = (source->_M_dataplus)._M_p;
    pcVar11 = pcVar9;
    if (uVar10 < 0xfffffffffffffffe) {
      uVar10 = local_1b8;
      do {
        local_1e1 = 10;
        _Var4 = std::
                __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          (pcVar11,(source->_M_dataplus)._M_p + source->_M_string_length,&local_1e1)
        ;
        pcVar11 = _Var4._M_current + 1;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
      pcVar9 = (source->_M_dataplus)._M_p;
    }
    local_1e1 = 10;
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      (pcVar11,pcVar9 + source->_M_string_length);
    local_1e0 = local_1d0;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_1e0,pcVar11,_Var4._M_current);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_1e0,local_1d8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0,local_1d0[0] + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  psVar5 = (string *)std::ios_base::~ios_base(local_138);
  return psVar5;
}

Assistant:

static std::string error_location_suffix(const std::string & source, size_t pos) {
  auto get_line = [&](size_t line) {
    auto start = source.begin();
    for (size_t i = 1; i < line; ++i) {
      start = std::find(start, source.end(), '\n') + 1;
    }
    auto end = std::find(start, source.end(), '\n');
    return std::string(start, end);
  };
  auto start = source.begin();
  auto end = source.end();
  auto it = start + pos;
  auto line = std::count(start, it, '\n') + 1;
  auto max_line = std::count(start, end, '\n') + 1;
  auto col = pos - std::string(start, it).rfind('\n');
  std::ostringstream out;
  out << " at row " << line << ", column " << col << ":\n";
  if (line > 1) out << get_line(line - 1) << "\n";
  out << get_line(line) << "\n";
  out << std::string(col - 1, ' ') << "^\n";
  if (line < max_line) out << get_line(line + 1) << "\n";

  return out.str();
}